

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void nuts_sleep(int msec)

{
  int iVar1;
  undefined1 local_20 [8];
  timespec ts;
  int msec_local;
  
  local_20 = (undefined1  [8])(long)(msec / 1000);
  ts.tv_sec = (__time_t)((msec % 1000) * 1000000);
  ts.tv_nsec._4_4_ = msec;
  do {
    if (local_20 == (undefined1  [8])0x0 && ts.tv_sec == 0) {
      return;
    }
    iVar1 = nanosleep((timespec *)local_20,(timespec *)local_20);
  } while (iVar1 != 0);
  return;
}

Assistant:

void
nuts_sleep(int msec)
{
#ifdef _WIN32
	Sleep(msec);
#elif defined(CLOCK_MONOTONIC)
	struct timespec ts;

	ts.tv_sec  = msec / 1000;
	ts.tv_nsec = (msec % 1000) * 1000000;

	// Do this in a loop, so that interrupts don't actually wake us.
	while (ts.tv_sec || ts.tv_nsec) {
		if (nanosleep(&ts, &ts) == 0) {
			break;
		}
	}
#else
	poll(NULL, 0, msec);
#endif
}